

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264e_sps.c
# Opt level: O0

MPP_RET h264e_sps_update(H264eSps *sps,MppEncCfgSet *cfg)

{
  MppFrameFormat MVar1;
  RK_U32 v;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  H264Level HVar6;
  int iVar7;
  int iVar8;
  RK_S32 RVar9;
  MppEncCpbInfo *pMVar10;
  int local_9c;
  int local_98;
  int local_94;
  int local_8c;
  RK_S32 log2_poc_lsb;
  RK_S32 log2_frm_num;
  RK_S32 log2_gop;
  RK_S32 min_level;
  RK_S32 i;
  RK_S32 mbs;
  RK_U8 force_flag;
  H264Level HStack_6c;
  RK_U8 constraint_force;
  RK_U32 set;
  H264Level level_idc;
  RK_S32 crop_bottom;
  RK_S32 crop_right;
  RK_S32 aligned_h;
  RK_S32 aligned_w;
  RK_S32 height;
  RK_S32 width;
  RK_S32 gop;
  MppFrameFormat fmt;
  MppEncCpbInfo *info;
  MppEncRefCfg ref;
  MppEncH264Cfg *h264;
  MppEncRcCfg *rc;
  MppEncPrepCfg *prep;
  H264eVui *vui;
  MppEncCfgSet *cfg_local;
  H264eSps *sps_local;
  
  pMVar10 = mpp_enc_ref_cfg_get_cpb_info(cfg->ref_cfg);
  MVar1 = (cfg->prep).format;
  v = (cfg->rc).gop;
  iVar2 = (cfg->prep).width;
  iVar3 = (cfg->prep).height;
  iVar7 = (iVar2 + 0xfU & 0xfffffff0) - iVar2;
  iVar8 = (iVar3 + 0xfU & 0xfffffff0) - iVar3;
  HStack_6c = (cfg->codec).field_1.h264.level;
  sps->profile_idc = (cfg->codec).field_1.h264.profile;
  iVar4 = sps->profile_idc;
  if (iVar4 == 0x42) {
    sps->constraint_set0 = 1;
    sps->constraint_set1 = 1;
    sps->constraint_set2 = 0;
    sps->constraint_set3 = 0;
    sps->constraint_set4 = 0;
    sps->constraint_set5 = 0;
  }
  else if (iVar4 == 0x4d) {
    sps->constraint_set0 = 0;
    sps->constraint_set1 = 1;
    sps->constraint_set2 = 0;
    sps->constraint_set3 = 0;
    sps->constraint_set4 = 0;
    sps->constraint_set5 = 0;
  }
  else if ((((iVar4 == 100) || (iVar4 == 0x6e)) || (iVar4 == 0x7a)) || (iVar4 == 0xf4)) {
    sps->constraint_set0 = 0;
    sps->constraint_set1 = 0;
    sps->constraint_set2 = 0;
    sps->constraint_set3 = 0;
    sps->constraint_set4 = 0;
    sps->constraint_set5 = 0;
  }
  else {
    sps->constraint_set0 = 0;
    sps->constraint_set1 = 0;
    sps->constraint_set2 = 0;
    sps->constraint_set3 = 0;
    sps->constraint_set4 = 0;
    sps->constraint_set5 = 0;
  }
  uVar5 = (cfg->codec).field_1.h264.constraint_set;
  if ((uVar5 & 0x10000) != 0) {
    sps->constraint_set0 = (uint)((uVar5 & 1) != 0);
  }
  if ((uVar5 & 0x20000) != 0) {
    sps->constraint_set1 = (uint)((uVar5 & 2) != 0);
  }
  if ((uVar5 & 0x40000) != 0) {
    sps->constraint_set2 = (uint)((uVar5 & 4) != 0);
  }
  if ((uVar5 & 0x80000) != 0) {
    sps->constraint_set3 = (uint)((uVar5 & 8) != 0);
  }
  if ((uVar5 & 0x100000) != 0) {
    sps->constraint_set4 = (uint)((uVar5 & 0x10) != 0);
  }
  if ((uVar5 & 0x200000) != 0) {
    sps->constraint_set5 = (uint)((uVar5 & 0x20) != 0);
  }
  log2_gop = 0;
  do {
    if (0x13 < log2_gop) {
LAB_002e1652:
      sps->level_idc = HStack_6c;
      sps->sps_id = 0;
      sps->chroma_format_idc = (uint)(MVar1 != MPP_FMT_YUV400);
      sps->pic_order_cnt_type = (cfg->codec).field_1.h264.hw_cfg.hw_poc_type;
      sps->log2_max_poc_lsb_minus4 = (cfg->codec).field_1.h264.log2_max_poc_lsb;
      sps->log2_max_frame_num_minus4 = (cfg->codec).field_1.h264.log2_max_frame_num;
      if (((int)v < 0) &&
         (_mpp_log_l(2,"h264e_sps","Assertion %s failed at %s:%d\n",(char *)0x0,"gop >= 0",
                     "h264e_sps_update",0xa9), (mpp_debug & 0x10000000) != 0)) {
        abort();
      }
      if (v == 0) {
        sps->log2_max_frame_num_minus4 = 0xc;
        sps->log2_max_poc_lsb_minus4 = 0xc;
      }
      else if (v == 1) {
        sps->log2_max_frame_num_minus4 = 0xc;
        sps->log2_max_poc_lsb_minus4 = 0xc;
      }
      else {
        RVar9 = mpp_log2(v);
        if (RVar9 < 0x11) {
          local_94 = mpp_log2(v);
        }
        else {
          local_94 = 0x10;
        }
        if (local_94 < 5) {
          local_98 = 0;
        }
        else {
          local_98 = local_94 + -4;
        }
        if (local_94 < 4) {
          local_9c = 0;
        }
        else {
          local_9c = local_94 + -3;
        }
        local_8c = local_9c;
        if (sps->log2_max_frame_num_minus4 < local_98) {
          sps->log2_max_frame_num_minus4 = local_98;
        }
        if (0xc < local_9c) {
          local_8c = 0xc;
        }
        if (sps->log2_max_poc_lsb_minus4 < local_8c) {
          sps->log2_max_poc_lsb_minus4 = local_8c;
        }
      }
      sps->num_ref_frames = pMVar10->dpb_size;
      sps->gaps_in_frame_num_value_allowed =
           (uint)(((cfg->codec).field_1.h264.gaps_not_allowed != 0 ^ 0xffU) & 1);
      sps->pic_width_in_mbs = (int)(iVar2 + 0xfU) >> 4;
      sps->pic_height_in_mbs = (int)(iVar3 + 0xfU) >> 4;
      sps->frame_mbs_only = 1;
      sps->direct8x8_inference = (cfg->codec).field_1.h264.transform8x8_mode;
      if ((iVar7 == 0) && (iVar8 == 0)) {
        sps->cropping = 0;
        memset(&sps->crop,0,0x10);
      }
      else {
        sps->cropping = 1;
        (sps->crop).left = 0;
        (sps->crop).right = iVar7;
        (sps->crop).top = 0;
        (sps->crop).bottom = iVar8;
      }
      memset(&sps->vui,0,0xb0);
      (sps->vui).vui_present = 1;
      (sps->vui).timing_info_present = 1;
      (sps->vui).time_scale = (cfg->rc).fps_out_num << 1;
      (sps->vui).num_units_in_tick = (cfg->rc).fps_out_denom;
      (sps->vui).fixed_frame_rate = (uint)(((cfg->rc).fps_out_flex != 0 ^ 0xffU) & 1);
      (sps->vui).vidformat = 5;
      if ((cfg->prep).range == MPP_FRAME_RANGE_JPEG) {
        (sps->vui).signal_type_present = 1;
        (sps->vui).fullrange = 1;
      }
      if (((((cfg->prep).colorprim < MPP_FRAME_PRI_NB) &&
           ((cfg->prep).colorprim != MPP_FRAME_PRI_UNSPECIFIED)) ||
          (((cfg->prep).colortrc < MPP_FRAME_TRC_NB &&
           ((cfg->prep).colortrc != MPP_FRAME_TRC_UNSPECIFIED)))) ||
         (((cfg->prep).color < MPP_FRAME_SPC_NB && ((cfg->prep).color != MPP_FRAME_SPC_UNSPECIFIED))
         )) {
        (sps->vui).signal_type_present = 1;
        (sps->vui).color_description_present = 1;
        (sps->vui).colorprim = (cfg->prep).colorprim;
        (sps->vui).colortrc = (cfg->prep).colortrc;
        (sps->vui).colmatrix = (cfg->prep).color;
      }
      (sps->vui).bitstream_restriction = 1;
      (sps->vui).motion_vectors_over_pic_boundaries = 1;
      (sps->vui).log2_max_mv_length_horizontal = 0xf;
      (sps->vui).log2_max_mv_length_vertical = 0xf;
      (sps->vui).max_dec_frame_buffering = pMVar10->dpb_size;
      return MPP_OK;
    }
    if ((int)((iVar2 + 0xfU & 0xfffffff0) * (iVar3 + 0xfU & 0xfffffff0)) >> 8 <=
        level_infos[log2_gop].max_MBs) {
      HVar6 = level_infos[log2_gop].level;
      if ((((int)HStack_6c < (int)HVar6) && (HVar6 != H264_LEVEL_1_b)) &&
         (HStack_6c = HVar6, (h264e_debug & 0x10) != 0)) {
        _mpp_log_l(4,"h264e_sps","set level to %s\n","h264e_sps_update",level_infos[log2_gop].name);
      }
      goto LAB_002e1652;
    }
    log2_gop = log2_gop + 1;
  } while( true );
}

Assistant:

MPP_RET h264e_sps_update(H264eSps *sps, MppEncCfgSet *cfg)
{
    H264eVui *vui = &sps->vui;
    MppEncPrepCfg *prep = &cfg->prep;
    MppEncRcCfg *rc = &cfg->rc;
    MppEncH264Cfg *h264 = &cfg->codec.h264;
    MppEncRefCfg ref = cfg->ref_cfg;
    MppEncCpbInfo *info = mpp_enc_ref_cfg_get_cpb_info(ref);
    MppFrameFormat fmt = prep->format;
    RK_S32 gop = rc->gop;
    RK_S32 width = prep->width;
    RK_S32 height = prep->height;
    RK_S32 aligned_w = MPP_ALIGN(width, 16);
    RK_S32 aligned_h = MPP_ALIGN(height, 16);
    RK_S32 crop_right = MPP_ALIGN(width, 16) - width;
    RK_S32 crop_bottom = MPP_ALIGN(height, 16) - height;
    /* default 720p */
    H264Level level_idc = h264->level;

    // default sps
    // profile baseline
    sps->profile_idc = h264->profile;
    switch (sps->profile_idc) {
    case H264_PROFILE_BASELINE : {
        sps->constraint_set0 = 1;
        sps->constraint_set1 = 1;
        sps->constraint_set2 = 0;
        sps->constraint_set3 = 0;
        sps->constraint_set4 = 0;
        sps->constraint_set5 = 0;
    } break;
    case H264_PROFILE_MAIN : {
        sps->constraint_set0 = 0;
        sps->constraint_set1 = 1;
        sps->constraint_set2 = 0;
        sps->constraint_set3 = 0;
        sps->constraint_set4 = 0;
        sps->constraint_set5 = 0;
    } break;
    case H264_PROFILE_HIGH :
    case H264_PROFILE_HIGH10 :
    case H264_PROFILE_HIGH422 :
    case H264_PROFILE_HIGH444 : {
        sps->constraint_set0 = 0;
        sps->constraint_set1 = 0;
        sps->constraint_set2 = 0;
        sps->constraint_set3 = 0;
        sps->constraint_set4 = 0;
        sps->constraint_set5 = 0;
    } break;
    default : {
        sps->constraint_set0 = 0;
        sps->constraint_set1 = 0;
        sps->constraint_set2 = 0;
        sps->constraint_set3 = 0;
        sps->constraint_set4 = 0;
        sps->constraint_set5 = 0;
    } break;
    }

    //updata constraint_set0~5
    RK_U32 set = h264->constraint_set;
    RK_U8 constraint_force = (set >> 0) & 0x3f;
    RK_U8 force_flag = (set >> 16) & 0x3f;

    if (force_flag & 1)
        sps->constraint_set0 = (constraint_force & 1) ? 1 : 0;
    if (force_flag & 2)
        sps->constraint_set1 = (constraint_force & 2) ? 1 : 0;
    if (force_flag & 4)
        sps->constraint_set2 = (constraint_force & 4) ? 1 : 0;
    if (force_flag & 8)
        sps->constraint_set3 = (constraint_force & 8) ? 1 : 0;
    if (force_flag & 16)
        sps->constraint_set4 = (constraint_force & 16) ? 1 : 0;
    if (force_flag & 32)
        sps->constraint_set5 = (constraint_force & 32) ? 1 : 0;

    // level_idc is connected with frame size
    {
        RK_S32 mbs = (aligned_w * aligned_h) >> 8;
        RK_S32 i;
        RK_S32 min_level = 10;

        for (i = 0; i < (RK_S32)MPP_ARRAY_ELEMS(level_infos); i++) {
            if (level_infos[i].max_MBs >= mbs) {
                min_level = level_infos[i].level;

                if (min_level > (RK_S32)level_idc &&
                    min_level != H264_LEVEL_1_b) {
                    level_idc = min_level;
                    h264e_dbg_sps("set level to %s\n", level_infos[i].name);
                }

                break;
            }
        }
    }
    sps->level_idc = level_idc;

    sps->sps_id = 0;
    sps->chroma_format_idc = (fmt == MPP_FMT_YUV400) ? H264_CHROMA_400 : H264_CHROMA_420;

    // set max frame number and poc lsb according to gop size
    sps->pic_order_cnt_type = h264->hw_cfg.hw_poc_type;
    sps->log2_max_poc_lsb_minus4 = h264->log2_max_poc_lsb;
    sps->log2_max_frame_num_minus4 = h264->log2_max_frame_num;

    mpp_assert(gop >= 0);
    if (gop == 0) {
        // only one I then all P frame
        sps->log2_max_frame_num_minus4 = 12;
        sps->log2_max_poc_lsb_minus4 = 12;
    } else if (gop == 1) {
        // all I frame
        sps->log2_max_frame_num_minus4 = 12;
        sps->log2_max_poc_lsb_minus4 = 12;
    } else {
        // normal case
        RK_S32 log2_gop = MPP_MIN(mpp_log2(gop), 16);
        RK_S32 log2_frm_num = (log2_gop <= 4) ? (0) : (log2_gop - 4);
        RK_S32 log2_poc_lsb = (log2_gop <= 3) ? (0) : (log2_gop - 3);

        if (sps->log2_max_frame_num_minus4 < log2_frm_num)
            sps->log2_max_frame_num_minus4 = log2_frm_num;

        if (log2_poc_lsb > 12)
            log2_poc_lsb = 12;

        if (sps->log2_max_poc_lsb_minus4 < log2_poc_lsb)
            sps->log2_max_poc_lsb_minus4 = log2_poc_lsb;
    }

    // max one reference frame
    sps->num_ref_frames = info->dpb_size;

    sps->gaps_in_frame_num_value_allowed = !h264->gaps_not_allowed;

    // default 720p without cropping
    sps->pic_width_in_mbs = aligned_w >> 4;
    sps->pic_height_in_mbs = aligned_h >> 4;
    sps->frame_mbs_only = 1;

    // baseline disable 8x8
    sps->direct8x8_inference = h264->transform8x8_mode;
    if (crop_right || crop_bottom) {
        sps->cropping = 1;
        sps->crop.left = 0;
        sps->crop.right = crop_right;
        sps->crop.top = 0;
        sps->crop.bottom = crop_bottom;
    } else {
        sps->cropping = 0;
        memset(&sps->crop, 0, sizeof(sps->crop));
    }

    memset(vui, 0, sizeof(*vui));
    vui->vui_present = 1;
    vui->timing_info_present = 1;
    vui->time_scale = rc->fps_out_num * 2;
    vui->num_units_in_tick = rc->fps_out_denom;
    vui->fixed_frame_rate = !rc->fps_out_flex;
    vui->vidformat = MPP_FRAME_VIDEO_FMT_UNSPECIFIED;

    if (prep->range == MPP_FRAME_RANGE_JPEG) {
        vui->signal_type_present = 1;
        vui->fullrange = 1;
    }

    if ((prep->colorprim <= MPP_FRAME_PRI_JEDEC_P22 &&
         prep->colorprim != MPP_FRAME_PRI_UNSPECIFIED) ||
        (prep->colortrc <= MPP_FRAME_TRC_ARIB_STD_B67 &&
         prep->colortrc != MPP_FRAME_TRC_UNSPECIFIED) ||
        (prep->color <= MPP_FRAME_SPC_ICTCP &&
         prep->color != MPP_FRAME_SPC_UNSPECIFIED)) {
        vui->signal_type_present = 1;
        vui->color_description_present = 1;
        vui->colorprim = prep->colorprim;
        vui->colortrc = prep->colortrc;
        vui->colmatrix = prep->color;
    }

    vui->bitstream_restriction = 1;
    vui->motion_vectors_over_pic_boundaries = 1;
    /* the max and default value has been changed to 15 since the 2016 standard */
    vui->log2_max_mv_length_horizontal = 15;
    vui->log2_max_mv_length_vertical = 15;
    vui->max_dec_frame_buffering = info->dpb_size;

    return MPP_OK;
}